

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManPrintFanio(Emb_Man_t *p)

{
  int *piVar1;
  ushort uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  uint uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  Emb_Man_t *extraout_RDX;
  int iVar9;
  uint uVar10;
  uint n;
  uint i;
  uint n_00;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  char Buffer [100];
  Emb_Man_t *pEVar8;
  
  n_00 = 0;
  n = 0;
  iVar9 = 0;
  iVar11 = 0;
  uVar4 = 0;
  while (((int)uVar4 < p->nObjData && (piVar1 = p->pObjData, piVar1 != (int *)0x0))) {
    uVar10 = piVar1[uVar4];
    if ((uVar4 == 0) || ((uVar10 & 3) != 0)) {
      uVar7 = piVar1[(ulong)uVar4 + 1];
    }
    else {
      uVar6 = uVar10 >> 4;
      uVar7 = piVar1[(ulong)uVar4 + 1];
      iVar9 = iVar9 + uVar6;
      iVar11 = iVar11 + uVar7;
      if (n_00 <= uVar6) {
        n_00 = uVar6;
      }
      if ((int)n <= (int)uVar7) {
        n = uVar7;
      }
    }
    uVar4 = uVar4 + (uVar10 >> 4) + uVar7 + 5;
  }
  iVar3 = Abc_Base10Log(n_00);
  uVar10 = iVar3 * 10 + 10;
  iVar3 = Abc_Base10Log(n);
  uVar4 = iVar3 * 10 + 10;
  if ((int)uVar4 < (int)uVar10) {
    uVar4 = uVar10;
  }
  p_00 = Vec_IntStart(uVar4);
  p_01 = Vec_IntStart(uVar4);
  uVar10 = 0;
  do {
    if ((p->nObjData <= (int)uVar10) || (piVar1 = p->pObjData, piVar1 == (int *)0x0)) {
      puts("The distribution of fanins and fanouts in the network:");
      puts("         Number   Nodes with fanin  Nodes with fanout");
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
        piVar1 = p_00->pArray;
        if ((piVar1[uVar12] != 0) || (p_01->pArray[uVar12] != 0)) {
          if (uVar12 < 10) {
            printf("%15d : ",uVar12 & 0xffffffff);
          }
          else {
            iVar3 = (int)((uVar12 & 0xffffffff) / 10) * -10;
            dVar14 = (double)(int)((uVar12 & 0xffffffff) / 10);
            dVar13 = pow(10.0,dVar14);
            dVar14 = pow(10.0,dVar14);
            sprintf(Buffer,"%d - %d",(ulong)(uint)(((int)uVar12 + iVar3) * (int)dVar13),
                    (ulong)(((int)uVar12 + iVar3 + 1) * (int)dVar14 - 1));
            printf("%15s : ",Buffer);
          }
          if (piVar1[uVar12] == 0) {
            printf("              ");
          }
          else {
            printf("%12d  ");
          }
          printf("    ");
          if (p_01->pArray[uVar12] == 0) {
            printf("              ");
          }
          else {
            printf("%12d  ");
          }
          putchar(10);
        }
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      dVar13 = (double)(p->nObjs - (p->vCis->nSize + p->vCos->nSize));
      printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
             (double)iVar9 / dVar13,(double)iVar11 / dVar13,(ulong)n_00,(ulong)n);
      return;
    }
    if ((uVar10 != 0) && (uVar7 = piVar1[uVar10], (uVar7 & 3) == 0)) {
      i = uVar7 >> 4;
      uVar6 = piVar1[(ulong)uVar10 + 1];
      pEVar8 = p;
      if (uVar7 < 0xa0) {
LAB_005c7fdb:
        Vec_IntAddToEntry(p_00,i,(int)pEVar8);
        pEVar8 = extraout_RDX;
      }
      else {
        if (uVar7 < 0x640) {
          i = (uint)(byte)((char)(((ushort)i & 0xff) / 10) + 10);
          goto LAB_005c7fdb;
        }
        if (uVar7 < 16000) {
          uVar5 = (ushort)((i & 0xffff) % 100);
          uVar2 = (short)((i & 0xffff) / 100) + 0x14;
LAB_005c7fd8:
          pEVar8 = (Emb_Man_t *)(ulong)uVar5;
          i = (uint)uVar2;
          goto LAB_005c7fdb;
        }
        if (uVar7 < 160000) {
          uVar5 = (ushort)((i & 0xffff) % 1000);
          uVar2 = (short)((i & 0xffff) / 1000) + 0x1e;
          goto LAB_005c7fd8;
        }
        if (uVar7 < 1600000) {
          pEVar8 = (Emb_Man_t *)((ulong)uVar7 % 160000);
          i = uVar7 / 160000 + 0x28;
          goto LAB_005c7fdb;
        }
        if (uVar7 < 16000000) {
          pEVar8 = (Emb_Man_t *)((ulong)uVar7 % 1600000);
          i = uVar7 / 1600000 + 0x32;
          goto LAB_005c7fdb;
        }
        if (uVar7 < 160000000) {
          pEVar8 = (Emb_Man_t *)((ulong)uVar7 % 16000000);
          i = uVar7 / 16000000 + 0x3c;
          goto LAB_005c7fdb;
        }
      }
      uVar7 = (uint)pEVar8;
      if (9 < (int)uVar6) {
        if (uVar6 < 100) {
          uVar6 = (uint)(byte)((char)(((ushort)uVar6 & 0xff) / 10) + 10);
        }
        else {
          if (uVar6 < 1000) {
            uVar7 = (uVar6 & 0xffff) % 100;
            uVar2 = (short)((uVar6 & 0xffff) / 100) + 0x14;
          }
          else {
            if (9999 < uVar6) {
              if (uVar6 < 100000) {
                uVar7 = uVar6 % 10000;
                uVar6 = uVar6 / 10000 + 0x28;
              }
              else if (uVar6 < 1000000) {
                uVar7 = uVar6 % 100000;
                uVar6 = uVar6 / 100000 + 0x32;
              }
              else {
                if (9999999 < uVar6) goto LAB_005c803d;
                uVar7 = uVar6 % 1000000;
                uVar6 = uVar6 / 1000000 + 0x3c;
              }
              goto LAB_005c802c;
            }
            uVar7 = (uVar6 & 0xffff) % 1000;
            uVar2 = (short)((uVar6 & 0xffff) / 1000) + 0x1e;
          }
          uVar6 = (uint)uVar2;
        }
      }
LAB_005c802c:
      Vec_IntAddToEntry(p_01,uVar6,uVar7);
    }
LAB_005c803d:
    uVar10 = uVar10 + ((uint)piVar1[uVar10] >> 4) + piVar1[(ulong)uVar10 + 1] + 5;
  } while( true );
}

Assistant:

void Emb_ManPrintFanio( Emb_Man_t * p )
{
    char Buffer[100];
    Emb_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Emb_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Emb_ManNodeNum(p)  );
}